

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O0

int bio_new(BIO *bio)

{
  void *pvVar1;
  bio_bio_st *b;
  BIO *bio_local;
  
  pvVar1 = OPENSSL_zalloc(0x38);
  if (pvVar1 != (void *)0x0) {
    *(undefined8 *)((long)pvVar1 + 0x20) = 0x4400;
    bio->ptr = pvVar1;
  }
  bio_local._4_4_ = (uint)(pvVar1 != (void *)0x0);
  return bio_local._4_4_;
}

Assistant:

static int bio_new(BIO *bio) {
  struct bio_bio_st *b =
      reinterpret_cast<bio_bio_st *>(OPENSSL_zalloc(sizeof *b));
  if (b == NULL) {
    return 0;
  }

  b->size = 17 * 1024;  // enough for one TLS record (just a default)
  bio->ptr = b;
  return 1;
}